

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.hpp
# Opt level: O0

bool __thiscall StructType::has_field(StructType *this,string *field_name)

{
  __type _Var1;
  size_type sVar2;
  const_reference __lhs;
  ulong local_28;
  size_t i;
  string *field_name_local;
  StructType *this_local;
  
  local_28 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Type_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Type_*>_>_>
            ::size(&this->fields);
    if (sVar2 <= local_28) {
      return false;
    }
    __lhs = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Type_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Type_*>_>_>
            ::operator[](&this->fields,local_28);
    _Var1 = std::operator==(&__lhs->first,field_name);
    if (_Var1) break;
    local_28 = local_28 + 1;
  }
  return true;
}

Assistant:

bool has_field(const std::string& field_name) const {
		for (std::size_t i = 0; i < fields.size(); ++i) {
			if (fields[i].first == field_name) {
				return true;
			}
		}
		return false;
	}